

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gla_ManReportMemory(Gla_Man_t *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double local_110;
  double local_100;
  double local_f0;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b0;
  double memOth;
  double memRef;
  double memMap;
  double memPro;
  double memSat;
  double memAig;
  double memTot;
  Gla_Obj_t *pGla;
  Gla_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p->pGia);
  lVar3 = (long)iVar1 * 0xc;
  auVar12._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar12._0_8_ = lVar3;
  auVar12._12_4_ = 0x45300000;
  dVar6 = (auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  dVar7 = sat_solver2_memory(p->pSat,1);
  dVar8 = sat_solver2_memory_proof(p->pSat);
  iVar1 = p->nObjs;
  iVar2 = Gia_ManObjNum(p->pGia);
  lVar3 = (long)iVar2 * 4 + (long)iVar1 * 0x28;
  auVar13._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar13._0_8_ = lVar3;
  auVar13._12_4_ = 0x45300000;
  memRef = (auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  dVar9 = Rnm_ManMemoryUsage(p->pRnm);
  for (memTot = (double)p->pObjs; (ulong)memTot < p->pObjs + p->nObjs;
      memTot = (double)((long)memTot + 0x28)) {
    iVar1 = Vec_IntCap((Vec_Int_t *)((long)memTot + 0x18));
    lVar3 = (long)iVar1 << 2;
    auVar14._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar14._0_8_ = lVar3;
    auVar14._12_4_ = 0x45300000;
    memRef = (auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) + memRef;
  }
  iVar1 = Vec_IntCap(p->vAddedNew);
  lVar3 = (long)iVar1 << 2;
  auVar16._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar16._0_8_ = lVar3;
  auVar16._12_4_ = 0x45300000;
  iVar1 = Vec_IntCap(p->vTemp);
  lVar4 = (long)iVar1 << 2;
  auVar17._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar17._0_8_ = lVar4;
  auVar17._12_4_ = 0x45300000;
  iVar1 = Vec_IntCap(p->vAbs);
  lVar5 = (long)iVar1 << 2;
  auVar15._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar15._0_8_ = lVar5;
  auVar15._12_4_ = 0x45300000;
  dVar10 = (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) +
           (auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) + 208.0 +
           (auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
  dVar11 = dVar6 + dVar7 + dVar8 + memRef + dVar9 + dVar10;
  Abc_Print(1,"%s =","Memory: AIG      ");
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_b0 = (dVar6 * 100.0) / dVar11;
  }
  else {
    local_b0 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar6 * 1.0) / 1048576.0,local_b0);
  Abc_Print(1,"%s =","Memory: SAT      ");
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_c0 = (dVar7 * 100.0) / dVar11;
  }
  else {
    local_c0 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar7 * 1.0) / 1048576.0,local_c0);
  Abc_Print(1,"%s =","Memory: Proof    ");
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_d0 = (dVar8 * 100.0) / dVar11;
  }
  else {
    local_d0 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar8 * 1.0) / 1048576.0,local_d0);
  Abc_Print(1,"%s =","Memory: Map      ");
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_e0 = (memRef * 100.0) / dVar11;
  }
  else {
    local_e0 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(memRef * 1.0) / 1048576.0,local_e0);
  Abc_Print(1,"%s =","Memory: Refine   ");
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_f0 = (dVar9 * 100.0) / dVar11;
  }
  else {
    local_f0 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar9 * 1.0) / 1048576.0,local_f0);
  Abc_Print(1,"%s =","Memory: Other    ");
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_100 = (dVar10 * 100.0) / dVar11;
  }
  else {
    local_100 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar10 * 1.0) / 1048576.0,local_100);
  Abc_Print(1,"%s =","Memory: TOTAL    ");
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_110 = (dVar11 * 100.0) / dVar11;
  }
  else {
    local_110 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar11 * 1.0) / 1048576.0,local_110);
  return;
}

Assistant:

void Gla_ManReportMemory( Gla_Man_t * p )
{
    Gla_Obj_t * pGla;
    double memTot = 0;
    double memAig = Gia_ManObjNum(p->pGia) * sizeof(Gia_Obj_t);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = p->nObjs * sizeof(Gla_Obj_t) + Gia_ManObjNum(p->pGia) * sizeof(int);
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memOth = sizeof(Gla_Man_t);
    for ( pGla = p->pObjs; pGla < p->pObjs + p->nObjs; pGla++ )
        memMap += Vec_IntCap(&pGla->vFrames) * sizeof(int);
    memOth += Vec_IntCap(p->vAddedNew) * sizeof(int);
    memOth += Vec_IntCap(p->vTemp) * sizeof(int);
    memOth += Vec_IntCap(p->vAbs) * sizeof(int);
    memTot = memAig + memSat + memPro + memMap + memRef + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}